

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

bar_base * __thiscall
booster::
callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::operator()(callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pcVar1;
  undefined8 uVar2;
  bar_base *pbVar3;
  undefined8 in_RSI;
  intrusive_ptr<booster::callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *in_RDI;
  bad_callback_call *in_stack_00000010;
  
  pcVar1 = intrusive_ptr<booster::callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ::get(in_RDI);
  if (pcVar1 == (callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x0) {
    uVar2 = __cxa_allocate_exception(0x30);
    bad_callback_call::bad_callback_call(in_stack_00000010);
    __cxa_throw(uVar2,&bad_callback_call::typeinfo,bad_callback_call::~bad_callback_call);
  }
  pcVar1 = intrusive_ptr<booster::callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ::operator*(in_RDI);
  pbVar3 = (bar_base *)(**(code **)(*(long *)pcVar1 + 0x10))(pcVar1,in_RSI);
  return pbVar3;
}

Assistant:

Result operator()(Params ...args) const			
		{ 								
			if(!call_ptr.get()) throw bad_callback_call();		
			return (*call_ptr)(args...); 		
		}